

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ipv4_address_no_zone.c
# Opt level: O0

LY_ERR lyplg_type_store_ipv4_address_no_zone
                 (ly_ctx *ctx,lysc_type *type,void *value,size_t value_len,uint32_t options,
                 LY_VALUE_FORMAT format,void *UNUSED_prefix_data,uint32_t hints,
                 lysc_node *UNUSED_ctx_node,lyd_value *storage,lys_glob_unres *UNUSED_unres,
                 ly_err_item **err)

{
  int iVar1;
  anon_union_24_16_e2776397_for_lyd_value_2 *__s;
  lyd_value_ipv4_address_no_zone *val;
  LY_ERR ret;
  LY_VALUE_FORMAT format_local;
  uint32_t options_local;
  size_t value_len_local;
  void *value_local;
  lysc_type *type_local;
  ly_ctx *ctx_local;
  
  val._4_4_ = LY_SUCCESS;
  memset(storage,0,0x28);
  __s = &storage->field_2;
  memset(__s,0,4);
  ret = options;
  value_len_local = (size_t)value;
  if (__s == (anon_union_24_16_e2776397_for_lyd_value_2 *)0x0) {
    val._4_4_ = LY_EMEM;
  }
  else {
    storage->realtype = type;
    if (format == LY_VALUE_LYB) {
      if (value_len == 4) {
        __s->int32 = *value;
      }
      else {
        val._4_4_ = ly_err_new(err,LY_EVALID,LYVE_DATA,(char *)0x0,(char *)0x0,
                               "Invalid LYB ipv4-address-no-zone value size %zu (expected 4).",
                               value_len);
      }
    }
    else {
      val._4_4_ = lyplg_type_check_hints
                            (hints,(char *)value,value_len,type->basetype,(int *)0x0,err);
      if (val._4_4_ == LY_SUCCESS) {
        if ((options & 1) == 0) {
          value_len_local = (size_t)strndup((char *)value,value_len);
          if ((char *)value_len_local == (char *)0x0) {
            val._4_4_ = LY_EMEM;
            goto LAB_002391c1;
          }
          ret = options | LY_EMEM;
        }
        iVar1 = inet_pton(2,(char *)value_len_local,__s);
        if (iVar1 == 0) {
          val._4_4_ = ly_err_new(err,LY_EVALID,LYVE_DATA,(char *)0x0,(char *)0x0,
                                 "Failed to convert IPv4 address \"%s\".",value_len_local);
        }
        else {
          val._4_4_ = lydict_insert_zc(ctx,(char *)value_len_local,&storage->_canonical);
          ret = LY_SUCCESS;
        }
      }
    }
  }
LAB_002391c1:
  if ((ret & LY_EMEM) != LY_SUCCESS) {
    free((void *)value_len_local);
  }
  if (val._4_4_ != LY_SUCCESS) {
    lyplg_type_free_simple(ctx,storage);
  }
  return val._4_4_;
}

Assistant:

static LY_ERR
lyplg_type_store_ipv4_address_no_zone(const struct ly_ctx *ctx, const struct lysc_type *type, const void *value,
        size_t value_len, uint32_t options, LY_VALUE_FORMAT format, void *UNUSED(prefix_data), uint32_t hints,
        const struct lysc_node *UNUSED(ctx_node), struct lyd_value *storage, struct lys_glob_unres *UNUSED(unres),
        struct ly_err_item **err)
{
    LY_ERR ret = LY_SUCCESS;
    struct lyd_value_ipv4_address_no_zone *val;

    /* init storage */
    memset(storage, 0, sizeof *storage);
    LYPLG_TYPE_VAL_INLINE_PREPARE(storage, val);
    LY_CHECK_ERR_GOTO(!val, ret = LY_EMEM, cleanup);
    storage->realtype = type;

    if (format == LY_VALUE_LYB) {
        /* validation */
        if (value_len != 4) {
            ret = ly_err_new(err, LY_EVALID, LYVE_DATA, NULL, NULL, "Invalid LYB ipv4-address-no-zone value size %zu "
                    "(expected 4).", value_len);
            goto cleanup;
        }

        /* store IP address */
        memcpy(&val->addr, value, 4);

        /* success */
        goto cleanup;
    }

    /* check hints */
    ret = lyplg_type_check_hints(hints, value, value_len, type->basetype, NULL, err);
    LY_CHECK_GOTO(ret, cleanup);

    /* we always need a dynamic value */
    if (!(options & LYPLG_TYPE_STORE_DYNAMIC)) {
        value = strndup(value, value_len);
        LY_CHECK_ERR_GOTO(!value, ret = LY_EMEM, cleanup);

        options |= LYPLG_TYPE_STORE_DYNAMIC;
    }

    /* get the network-byte order address, validates the value */
    if (!inet_pton(AF_INET, value, &val->addr)) {
        ret = ly_err_new(err, LY_EVALID, LYVE_DATA, NULL, NULL, "Failed to convert IPv4 address \"%s\".", (char *)value);
        goto cleanup;
    }

    /* store canonical value */
    ret = lydict_insert_zc(ctx, (char *)value, &storage->_canonical);
    options &= ~LYPLG_TYPE_STORE_DYNAMIC;
    LY_CHECK_GOTO(ret, cleanup);

cleanup:
    if (options & LYPLG_TYPE_STORE_DYNAMIC) {
        free((void *)value);
    }

    if (ret) {
        lyplg_type_free_simple(ctx, storage);
    }
    return ret;
}